

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

double av1_estimate_coeff_entropy(double q_step,double b,double zero_bin_ratio,int qcoeff)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (b <= 1e-07) {
    b = 1e-07;
  }
  dVar3 = (zero_bin_ratio * -0.5 * q_step) / b;
  if (dVar3 <= 700.0) {
    dVar4 = 0.0;
    if (-700.0 <= dVar3) {
      dVar4 = exp(dVar3);
    }
  }
  else {
    dVar4 = 1.79769313486232e+308;
  }
  if (dVar4 <= 1e-07) {
    dVar4 = 1e-07;
  }
  if (qcoeff == 0) {
    dVar3 = log2(1.0 - dVar4);
    dVar3 = -dVar3;
  }
  else {
    iVar1 = -qcoeff;
    if (0 < qcoeff) {
      iVar1 = qcoeff;
    }
    dVar3 = -q_step / b;
    if (dVar3 <= 700.0) {
      dVar2 = 0.0;
      if (-700.0 <= dVar3) {
        dVar2 = exp(dVar3);
      }
    }
    else {
      dVar2 = 1.79769313486232e+308;
    }
    if (dVar2 <= 1e-07) {
      dVar2 = 1e-07;
    }
    dVar3 = log2(dVar4);
    dVar4 = log2(1.0 - dVar2);
    dVar2 = log2(dVar2);
    dVar3 = ((1.0 - dVar3) - dVar4) - dVar2 * (double)(iVar1 + -1);
  }
  return dVar3;
}

Assistant:

double av1_estimate_coeff_entropy(double q_step, double b,
                                  double zero_bin_ratio, int qcoeff) {
  b = AOMMAX(b, TPL_EPSILON);
  int abs_qcoeff = abs(qcoeff);
  double z0 = fmax(exp_bounded(-zero_bin_ratio / 2 * q_step / b), TPL_EPSILON);
  if (abs_qcoeff == 0) {
    double r = -log2(1 - z0);
    return r;
  } else {
    double z = fmax(exp_bounded(-q_step / b), TPL_EPSILON);
    double r = 1 - log2(z0) - log2(1 - z) - (abs_qcoeff - 1) * log2(z);
    return r;
  }
}